

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O3

Result __thiscall
QTapAndHoldGestureRecognizer::recognize
          (QTapAndHoldGestureRecognizer *this,QGesture *state,QObject *object,QEvent *event)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  QPoint QVar4;
  int iVar5;
  double dVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  lVar2 = *(long *)&state->field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 == 1 && object == &state->super_QObject) {
    QBasicTimer::stop();
    return (Result)0x108;
  }
  if (uVar1 < 0x9c) {
    if (uVar1 < 5) {
      if (uVar1 != 2) {
        if (uVar1 != 3) {
          return (Result)1;
        }
        return (Result)0x10;
      }
      auVar16 = QEventPoint::globalPosition();
      auVar17._0_8_ =
           (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._0_8_;
      auVar17._8_8_ =
           (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._8_8_;
      auVar16 = maxpd(auVar17,_DAT_006605e0);
      *(double *)(lVar2 + 0xa8) =
           (double)(int)(double)(~-(ulong)(2147483647.0 < auVar17._0_8_) & auVar16._0_8_ |
                                -(ulong)(2147483647.0 < auVar17._0_8_) & 0x41dfffffffc00000);
      *(double *)(lVar2 + 0xb0) =
           (double)(int)(double)(~-(ulong)(2147483647.0 < auVar17._8_8_) & auVar16._8_8_ |
                                -(ulong)(2147483647.0 < auVar17._8_8_) & 0x41dfffffffc00000);
      goto LAB_002f3a75;
    }
    if (uVar1 == 5) {
      auVar16 = QEventPoint::globalPosition();
      if (*(int *)(lVar2 + 0xb8) == 0) {
        return (Result)0x10;
      }
      auVar11._0_8_ =
           (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._0_8_;
      auVar11._8_8_ =
           (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._8_8_;
      auVar12 = maxpd(auVar11,_DAT_006605e0);
      auVar10._0_8_ =
           (double)((ulong)*(double *)(lVar2 + 0xa8) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(lVar2 + 0xa8);
      auVar10._8_8_ =
           (double)((ulong)*(double *)(lVar2 + 0xb0) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(lVar2 + 0xb0);
      auVar16 = maxpd(auVar10,_DAT_006605e0);
      iVar13 = (int)(double)(~-(ulong)(2147483647.0 < auVar11._0_8_) & auVar12._0_8_ |
                            -(ulong)(2147483647.0 < auVar11._0_8_) & 0x41dfffffffc00000) -
               (int)(double)(~-(ulong)(2147483647.0 < auVar10._0_8_) & auVar16._0_8_ |
                            -(ulong)(2147483647.0 < auVar10._0_8_) & 0x41dfffffffc00000);
      iVar15 = (int)(double)(~-(ulong)(2147483647.0 < auVar11._8_8_) & auVar12._8_8_ |
                            -(ulong)(2147483647.0 < auVar11._8_8_) & 0x41dfffffffc00000) -
               (int)(double)(~-(ulong)(2147483647.0 < auVar10._8_8_) & auVar16._8_8_ |
                            -(ulong)(2147483647.0 < auVar10._8_8_) & 0x41dfffffffc00000);
      iVar5 = iVar13 >> 0x1f;
      iVar7 = iVar15 >> 0x1f;
      uVar3 = CONCAT44(iVar15,iVar13) ^ CONCAT44(iVar7,iVar5);
      iVar5 = ((int)(uVar3 >> 0x20) - iVar7) + ((int)uVar3 - iVar5);
      goto LAB_002f3b94;
    }
    if (uVar1 != 0x9b) {
      return (Result)1;
    }
    QVar4 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
    if (*(int *)(lVar2 + 0xb8) == 0) {
      return (Result)0x10;
    }
    auVar9._0_8_ = (double)((ulong)*(double *)(lVar2 + 0xa8) & 0x8000000000000000 |
                           0x3fe0000000000000) + *(double *)(lVar2 + 0xa8);
    auVar9._8_8_ = (double)((ulong)*(double *)(lVar2 + 0xb0) & 0x8000000000000000 |
                           0x3fe0000000000000) + *(double *)(lVar2 + 0xb0);
    auVar16 = maxpd(auVar9,_DAT_006605e0);
    dVar6 = (double)(~-(ulong)(2147483647.0 < auVar9._0_8_) & auVar16._0_8_ |
                    -(ulong)(2147483647.0 < auVar9._0_8_) & 0x41dfffffffc00000);
    dVar8 = (double)(~-(ulong)(2147483647.0 < auVar9._8_8_) & auVar16._8_8_ |
                    -(ulong)(2147483647.0 < auVar9._8_8_) & 0x41dfffffffc00000);
LAB_002f3b76:
    iVar13 = QVar4.xp.m_i.m_i - (int)dVar6;
    iVar15 = QVar4.yp.m_i.m_i - (int)dVar8;
    iVar5 = iVar13 >> 0x1f;
    iVar7 = iVar15 >> 0x1f;
    uVar3 = CONCAT44(iVar15,iVar13) ^ CONCAT44(iVar7,iVar5);
    iVar5 = ((int)(uVar3 >> 0x20) - iVar7) + ((int)uVar3 - iVar5);
LAB_002f3b94:
    if (iVar5 < 0x29) {
      return (Result)2;
    }
    return (Result)0x10;
  }
  if (uVar1 < 0xc2) {
    if (uVar1 != 0x9c) {
      if (uVar1 != 0x9d) {
        return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
               (QFlagsStorage<QGestureRecognizer::ResultFlag>)0x1;
      }
      return (Result)0x10;
    }
    QVar4 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
    auVar16._8_8_ = (double)QVar4.yp.m_i.m_i;
    auVar16._0_8_ = (double)QVar4.xp.m_i.m_i;
  }
  else {
    if (uVar1 != 0xc2) {
      if (uVar1 != 0xc3) {
        if (uVar1 != 0xc4) {
          return (Result)1;
        }
        return (Result)0x10;
      }
      if (*(int *)(lVar2 + 0xb8) == 0) {
        return (Result)0x10;
      }
      if (*(long *)(event + 0x38) != 1) {
        return (Result)0x10;
      }
      auVar16 = QEventPoint::position();
      auVar17 = QEventPoint::pressPosition();
      auVar14._0_8_ =
           (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._8_8_;
      auVar14._8_8_ =
           (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._0_8_;
      auVar16 = maxpd(auVar14,_DAT_006605e0);
      QVar4.xp.m_i = (int)(double)(~-(ulong)(2147483647.0 < auVar14._0_8_) & auVar16._0_8_ |
                                  -(ulong)(2147483647.0 < auVar14._0_8_) & 0x41dfffffffc00000);
      QVar4.yp.m_i = (int)(double)(~-(ulong)(2147483647.0 < auVar14._8_8_) & auVar16._8_8_ |
                                  -(ulong)(2147483647.0 < auVar14._8_8_) & 0x41dfffffffc00000);
      auVar12._0_8_ =
           (double)((ulong)auVar17._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar17._8_8_;
      auVar12._8_8_ =
           (double)((ulong)auVar17._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar17._0_8_;
      auVar16 = maxpd(auVar12,_DAT_006605e0);
      dVar6 = (double)(~-(ulong)(2147483647.0 < auVar12._0_8_) & auVar16._0_8_ |
                      -(ulong)(2147483647.0 < auVar12._0_8_) & 0x41dfffffffc00000);
      dVar8 = (double)(~-(ulong)(2147483647.0 < auVar12._8_8_) & auVar16._8_8_ |
                      -(ulong)(2147483647.0 < auVar12._8_8_) & 0x41dfffffffc00000);
      goto LAB_002f3b76;
    }
    auVar16 = QEventPoint::globalPressPosition();
  }
  *(undefined1 (*) [16])(lVar2 + 0xa8) = auVar16;
LAB_002f3a75:
  QGesture::setHotSpot(state,(QPointF *)(lVar2 + 0xa8));
  QBasicTimer::start(lVar2 + 0xb8,(long)QTapAndHoldGesturePrivate::Timeout * 1000000,1,state);
  return (Result)2;
}

Assistant:

QGestureRecognizer::Result
QTapAndHoldGestureRecognizer::recognize(QGesture *state, QObject *object,
                                        QEvent *event)
{
    QTapAndHoldGesture *q = static_cast<QTapAndHoldGesture *>(state);
    QTapAndHoldGesturePrivate *d = q->d_func();

    if (object == state && event->type() == QEvent::Timer) {
        d->tapAndHoldTimer.stop();
        return QGestureRecognizer::FinishGesture | QGestureRecognizer::ConsumeEventHint;
    }

    enum { TapRadius = 40 };

    switch (event->type()) {
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        d->position = gsme->screenPos();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#endif
    case QEvent::MouseButtonPress: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        d->position = me->globalPosition().toPoint();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
    case QEvent::TouchBegin: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        d->position = ev->points().at(0).globalPressPosition();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseRelease:
#endif
    case QEvent::MouseButtonRelease:
    case QEvent::TouchEnd:
        return QGestureRecognizer::CancelGesture; // get out of the MayBeGesture state
    case QEvent::TouchUpdate: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        if (d->tapAndHoldTimer.isActive() && ev->points().size() == 1) {
            const QEventPoint &p = ev->points().at(0);
            QPoint delta = p.position().toPoint() - p.pressPosition().toPoint();
            if (delta.manhattanLength() <= TapRadius)
                return QGestureRecognizer::MayBeGesture;
        }
        return QGestureRecognizer::CancelGesture;
    }
    case QEvent::MouseMove: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        QPoint delta = me->globalPosition().toPoint() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseMove: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        QPoint delta = gsme->screenPos() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#endif
    default:
        return QGestureRecognizer::Ignore;
    }
}